

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O3

void __thiscall
ASCFile::ASCFile(ASCFile *this,vector<char,_std::allocator<char>_> *buf,path *filepath)

{
  pointer pBVar1;
  undefined8 uVar2;
  bool bVar3;
  char *__locale;
  path directory;
  error_code ec;
  undefined1 local_d0 [32];
  _Impl *local_b0;
  undefined1 local_a8 [40];
  string local_80;
  string local_60;
  int local_40;
  long *local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022b268;
  this->m_firstformat = true;
  this->m_firstpin = true;
  this->m_firstnail = true;
  local_40 = 0;
  local_38 = (long *)std::_V2::system_category();
  std::filesystem::weakly_canonical((path *)local_a8,(error_code *)filepath);
  if (local_40 == 0) {
    std::filesystem::__cxx11::path::parent_path();
    std::__cxx11::string::operator=((string *)local_a8,(string *)local_d0);
    uVar2 = local_a8._32_8_;
    local_a8._32_8_ = local_b0;
    local_b0 = (_Impl *)0x0;
    if ((_Impl *)uVar2 != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)(local_a8 + 0x20),(_Impl *)uVar2);
    }
    std::filesystem::__cxx11::path::clear((path *)local_d0);
    std::filesystem::__cxx11::path::~path((path *)local_d0);
    __locale = setlocale(1,"C");
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"format.asc","");
    bVar3 = load_and_parse(this,(path *)local_a8,(string *)local_d0,0x128aec);
    if (bVar3) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"pins.asc","");
      bVar3 = load_and_parse(this,(path *)local_a8,&local_60,0x128b76);
      if (bVar3) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"nails.asc","");
        bVar3 = load_and_parse(this,(path *)local_a8,&local_80,0x129618);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    (this->super_BRDFileBase).valid = bVar3;
    pBVar1 = (this->super_BRDFileBase).format.
             super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    (this->super_BRDFileBase).num_parts =
         (int)((ulong)((long)(this->super_BRDFileBase).parts.
                             super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->super_BRDFileBase).parts.
                            super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
    (this->super_BRDFileBase).num_pins =
         (int)((ulong)((long)(this->super_BRDFileBase).pins.
                             super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->super_BRDFileBase).pins.
                            super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) * -0x49249249;
    (this->super_BRDFileBase).num_format =
         (uint)((ulong)((long)pBVar1 -
                       (long)(this->super_BRDFileBase).format.
                             super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
    (this->super_BRDFileBase).num_nails =
         (int)((ulong)((long)(this->super_BRDFileBase).nails.
                             super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->super_BRDFileBase).nails.
                            super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    setlocale(1,__locale);
  }
  else {
    (**(code **)(*local_38 + 0x20))(local_d0);
    std::__cxx11::string::operator=
              ((string *)&(this->super_BRDFileBase).error_msg,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
  }
  std::filesystem::__cxx11::path::~path((path *)local_a8);
  return;
}

Assistant:

ASCFile::ASCFile(std::vector<char> &buf, const filesystem::path &filepath) {
	std::error_code ec;
	auto directory = filesystem::weakly_canonical(filepath, ec);
	if (ec) {
		error_msg = ec.message();
		return;
	}
	directory = directory.parent_path();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (!load_and_parse(directory, "format.asc", &ASCFile::parse_format)
		|| !load_and_parse(directory, "pins.asc", &ASCFile::parse_pin)
		|| !load_and_parse(directory, "nails.asc", &ASCFile::parse_nail)) {
		valid = false;
	} else {
		valid = true;
	}

	update_counts();
	setlocale(LC_NUMERIC, saved_locale); // Restore locale
}